

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

void duckdb::DecimalRoundNegativePrecisionFunction<short,duckdb::NumericHelper>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  short sVar1;
  short sVar2;
  int iVar3;
  ulong count;
  short *psVar4;
  short *psVar5;
  unsigned_long *puVar6;
  data_ptr_t pdVar7;
  ulong uVar8;
  data_ptr_t pdVar9;
  sel_t *psVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  byte bVar13;
  byte bVar14;
  BoundFunctionExpression *pBVar15;
  pointer pFVar16;
  const_reference pvVar17;
  pointer pEVar18;
  reference vector;
  TemplatedValidityData<unsigned_long> *pTVar19;
  _Head_base<0UL,_unsigned_long_*,_false> _Var20;
  short sVar21;
  ulong uVar22;
  short sVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  idx_t idx_in_entry;
  ulong uVar27;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  data_ptr_t local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  pBVar15 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  pFVar16 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->(&pBVar15->bind_info);
  pvVar17 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](&pBVar15->children,0);
  pEVar18 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar17);
  bVar13 = DecimalType::GetScale(&pEVar18->return_type);
  pvVar17 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](&pBVar15->children,0);
  pEVar18 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar17);
  bVar14 = DecimalType::GetWidth(&pEVar18->return_type);
  iVar3 = *(int *)&pFVar16[1]._vptr_FunctionData;
  if ((int)((uint)bVar13 - (uint)bVar14) < iVar3) {
    sVar1 = *(short *)(NumericHelper::POWERS_OF_TEN + (long)(int)((uint)bVar13 - iVar3) * 8);
    sVar2 = *(short *)(NumericHelper::POWERS_OF_TEN + (long)iVar3 * -8);
    sVar23 = (short)((uint)(int)(short)(sVar1 - (sVar1 >> 0xf)) >> 1);
    vector = vector<duckdb::Vector,_true>::operator[](&input->data,0);
    count = input->count;
    if (vector->vector_type == FLAT_VECTOR) {
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar9 = result->data;
      pdVar7 = vector->data;
      FlatVector::VerifyFlatVector(vector);
      FlatVector::VerifyFlatVector(result);
      puVar6 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar6 == (unsigned_long *)0x0) {
        if (count != 0) {
          uVar27 = 0;
          do {
            sVar21 = sVar23;
            if (*(short *)(pdVar7 + uVar27 * 2) < 0) {
              sVar21 = -sVar23;
            }
            *(short *)(pdVar9 + uVar27 * 2) =
                 ((short)(sVar21 + *(short *)(pdVar7 + uVar27 * 2)) / sVar1) * sVar2;
            uVar27 = uVar27 + 1;
          } while (count != uVar27);
        }
      }
      else {
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar6;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if (0x3f < count + 0x3f) {
          puVar6 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          uVar24 = 0;
          uVar27 = 0;
          do {
            if (puVar6 == (unsigned_long *)0x0) {
              uVar25 = uVar27 + 0x40;
              if (count <= uVar27 + 0x40) {
                uVar25 = count;
              }
LAB_00fc5fdf:
              uVar26 = uVar27;
              if (uVar27 < uVar25) {
                do {
                  sVar21 = sVar23;
                  if (*(short *)(pdVar7 + uVar27 * 2) < 0) {
                    sVar21 = -sVar23;
                  }
                  *(short *)(pdVar9 + uVar27 * 2) =
                       ((short)(sVar21 + *(short *)(pdVar7 + uVar27 * 2)) / sVar1) * sVar2;
                  uVar27 = uVar27 + 1;
                  uVar26 = uVar25;
                } while (uVar25 != uVar27);
              }
            }
            else {
              uVar8 = puVar6[uVar24];
              uVar25 = uVar27 + 0x40;
              if (count <= uVar27 + 0x40) {
                uVar25 = count;
              }
              uVar26 = uVar25;
              if (uVar8 != 0) {
                if (uVar8 == 0xffffffffffffffff) goto LAB_00fc5fdf;
                uVar26 = uVar27;
                if (uVar27 < uVar25) {
                  uVar22 = 0;
                  do {
                    if ((uVar8 >> (uVar22 & 0x3f) & 1) != 0) {
                      sVar21 = sVar23;
                      if (*(short *)(pdVar7 + uVar22 * 2 + uVar27 * 2) < 0) {
                        sVar21 = -sVar23;
                      }
                      *(short *)(pdVar9 + uVar22 * 2 + uVar27 * 2) =
                           ((short)(sVar21 + *(short *)(pdVar7 + uVar22 * 2 + uVar27 * 2)) / sVar1)
                           * sVar2;
                    }
                    uVar22 = uVar22 + 1;
                    uVar26 = uVar25;
                  } while (uVar25 - uVar27 != uVar22);
                }
              }
            }
            uVar24 = uVar24 + 1;
            uVar27 = uVar26;
          } while (uVar24 != count + 0x3f >> 6);
        }
      }
    }
    else if (vector->vector_type == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      psVar4 = (short *)result->data;
      psVar5 = (short *)vector->data;
      puVar6 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar6 != (unsigned_long *)0x0) && ((*puVar6 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      sVar21 = -sVar23;
      if (-1 < *psVar5) {
        sVar21 = sVar23;
      }
      *psVar4 = sVar2 * ((short)(sVar21 + *psVar5) / sVar1);
    }
    else {
      UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
      Vector::ToUnifiedFormat(vector,count,&local_78);
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar9 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (count != 0) {
          psVar10 = (local_78.sel)->sel_vector;
          uVar27 = 0;
          do {
            uVar24 = uVar27;
            if (psVar10 != (sel_t *)0x0) {
              uVar24 = (ulong)psVar10[uVar27];
            }
            sVar21 = sVar23;
            if (*(short *)(local_78.data + uVar24 * 2) < 0) {
              sVar21 = -sVar23;
            }
            *(short *)(pdVar9 + uVar27 * 2) =
                 ((short)(sVar21 + *(short *)(local_78.data + uVar24 * 2)) / sVar1) * sVar2;
            uVar27 = uVar27 + 1;
          } while (count != uVar27);
        }
      }
      else if (count != 0) {
        psVar10 = (local_78.sel)->sel_vector;
        uVar27 = 0;
        local_88 = local_78.data;
        do {
          uVar24 = uVar27;
          if (psVar10 != (sel_t *)0x0) {
            uVar24 = (ulong)psVar10[uVar27];
          }
          if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar24 >> 6] >> (uVar24 & 0x3f) & 1) == 0) {
            _Var20._M_head_impl =
                 (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (_Var20._M_head_impl == (unsigned_long *)0x0) {
              local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_98,&local_80);
              p_Var12 = p_Stack_90;
              peVar11 = local_98;
              local_98 = (element_type *)0x0;
              p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar11;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var12;
              if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
                 p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
              }
              pTVar19 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              _Var20._M_head_impl =
                   (pTVar19->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var20._M_head_impl;
              local_78.data = local_88;
            }
            bVar13 = (byte)uVar27 & 0x3f;
            _Var20._M_head_impl[uVar27 >> 6] =
                 _Var20._M_head_impl[uVar27 >> 6] &
                 (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
          }
          else {
            sVar21 = sVar23;
            if (*(short *)(local_78.data + uVar24 * 2) < 0) {
              sVar21 = -sVar23;
            }
            *(short *)(pdVar9 + uVar27 * 2) =
                 ((short)(sVar21 + *(short *)(local_78.data + uVar24 * 2)) / sVar1) * sVar2;
          }
          uVar27 = uVar27 + 1;
        } while (count != uVar27);
      }
      if (local_78.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
  }
  else {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    Value::INTEGER((Value *)&local_78,0);
    Vector::SetValue(result,0,(Value *)&local_78);
    Value::~Value((Value *)&local_78);
  }
  return;
}

Assistant:

static void DecimalRoundNegativePrecisionFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RoundPrecisionFunctionData>();
	auto source_scale = DecimalType::GetScale(func_expr.children[0]->return_type);
	auto width = DecimalType::GetWidth(func_expr.children[0]->return_type);
	if (info.target_scale <= -int32_t(width - source_scale)) {
		// scale too big for width
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		result.SetValue(0, Value::INTEGER(0));
		return;
	}
	T divide_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale + source_scale]);
	T multiply_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale]);
	T addition = divide_power_of_ten / 2;

	UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
		if (input < 0) {
			input -= addition;
		} else {
			input += addition;
		}
		return UnsafeNumericCast<T>(input / divide_power_of_ten * multiply_power_of_ten);
	});
}